

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalWrapper.cpp
# Opt level: O0

Expression * __thiscall IRT::ConditionalWrapper::ToExpression(ConditionalWrapper *this)

{
  int iVar1;
  TempExpression *pTVar2;
  EseqExpression *this_00;
  SeqStatement *this_01;
  MoveStatement *this_02;
  ConstExpression *pCVar3;
  SeqStatement *this_03;
  undefined4 extraout_var;
  SeqStatement *this_04;
  LabelStatement *this_05;
  SeqStatement *this_06;
  MoveStatement *this_07;
  LabelStatement *this_08;
  Label local_110;
  undefined1 local_e9;
  Label local_e8;
  Label local_c8;
  Label local_a8;
  undefined1 local_88 [8];
  Label label_false;
  Label label_true;
  Temporary local_38;
  TempExpression *local_18;
  TempExpression *temp_expression;
  ConditionalWrapper *this_local;
  
  temp_expression = (TempExpression *)this;
  pTVar2 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary(&local_38);
  TempExpression::TempExpression(pTVar2,&local_38);
  Temporary::~Temporary(&local_38);
  local_18 = pTVar2;
  Label::Label((Label *)((long)&label_false.label_.field_2 + 8));
  Label::Label((Label *)local_88);
  this_00 = (EseqExpression *)operator_new(0x18);
  this_01 = (SeqStatement *)operator_new(0x18);
  this_02 = (MoveStatement *)operator_new(0x18);
  pTVar2 = local_18;
  pCVar3 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar3,1);
  MoveStatement::MoveStatement(this_02,&pTVar2->super_Expression,(Expression *)pCVar3);
  this_03 = (SeqStatement *)operator_new(0x18);
  Label::Label(&local_a8,(Label *)((long)&label_false.label_.field_2 + 8));
  Label::Label(&local_c8,(Label *)local_88);
  iVar1 = (*(this->super_SubtreeWrapper)._vptr_SubtreeWrapper[4])(this,&local_a8,&local_c8);
  this_04 = (SeqStatement *)operator_new(0x18);
  this_05 = (LabelStatement *)operator_new(0x28);
  local_e9 = 1;
  Label::Label(&local_e8,(Label *)local_88);
  LabelStatement::LabelStatement(this_05,&local_e8);
  local_e9 = 0;
  this_06 = (SeqStatement *)operator_new(0x18);
  this_07 = (MoveStatement *)operator_new(0x18);
  pTVar2 = local_18;
  pCVar3 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar3,0);
  MoveStatement::MoveStatement(this_07,&pTVar2->super_Expression,(Expression *)pCVar3);
  this_08 = (LabelStatement *)operator_new(0x28);
  Label::Label(&local_110,(Label *)((long)&label_false.label_.field_2 + 8));
  LabelStatement::LabelStatement(this_08,&local_110);
  SeqStatement::SeqStatement(this_06,(Statement *)this_07,(Statement *)this_08);
  SeqStatement::SeqStatement(this_04,(Statement *)this_05,(Statement *)this_06);
  SeqStatement::SeqStatement(this_03,(Statement *)CONCAT44(extraout_var,iVar1),(Statement *)this_04)
  ;
  SeqStatement::SeqStatement(this_01,(Statement *)this_02,(Statement *)this_03);
  EseqExpression::EseqExpression(this_00,(Statement *)this_01,&local_18->super_Expression);
  Label::~Label(&local_110);
  Label::~Label(&local_e8);
  Label::~Label(&local_c8);
  Label::~Label(&local_a8);
  Label::~Label((Label *)local_88);
  Label::~Label((Label *)((long)&label_false.label_.field_2 + 8));
  return &this_00->super_Expression;
}

Assistant:

Expression *IRT::ConditionalWrapper::ToExpression() {
    auto* temp_expression = new TempExpression(Temporary());
    Label label_true;
    Label label_false;
    return new EseqExpression(
      new SeqStatement(
        new MoveStatement(temp_expression, new ConstExpression(1)),
        new SeqStatement(
          ToConditional(label_true, label_false),
          new SeqStatement(
            new LabelStatement(label_false),
            new SeqStatement(
              new MoveStatement(temp_expression, new ConstExpression(0)),
              new LabelStatement(label_true)
            )
          )
        )
      ),
      temp_expression
    );
}